

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_gt.cpp
# Opt level: O3

void __thiscall IsingFreeEnergy_Square0_Test::TestBody(IsingFreeEnergy_Square0_Test *this)

{
  fvar<double,_2UL> beta;
  square *in_RSI;
  char *pcVar1;
  AssertionResult gtest_ar;
  fvar<double,_2UL> f;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> b0;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  double local_60;
  double local_58;
  fvar<double,_2UL> local_50;
  double local_38;
  undefined8 uStack_30;
  double local_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  local_58 = convert<double>("1.5");
  local_60 = convert<double>("2.5");
  local_38 = convert<double>("2");
  local_38 = 1.0 / local_38;
  uStack_30 = 0;
  uStack_18 = 0x3ff0000000000000;
  uStack_10 = 0;
  beta.v._M_elems[1] = 1.0;
  beta.v._M_elems[0] = local_38;
  beta.v._M_elems[2] = 0.0;
  local_20 = local_38;
  ising::free_energy::square::
  infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
            (&local_50,in_RSI,local_58,local_60,beta);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_70,"-4.0007112633153277","free_energy(f, beta)",-4.000711263315328,
             local_50.v._M_elems[0]);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_gt.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_70,"-3.9941706779898838","energy(f, beta)",-3.994170677989884,
             local_50.v._M_elems[1] * local_38 + local_50.v._M_elems[0]);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_gt.cpp"
               ,0x25,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_70,"0.024138928587813167","specific_heat(f, beta)",0.024138928587813167,
             -local_38 * local_38 *
             (local_50.v._M_elems[1] + local_50.v._M_elems[1] +
             (local_50.v._M_elems[2] + local_50.v._M_elems[2]) * local_38));
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_gt.cpp"
               ,0x26,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST(IsingFreeEnergy, Square0) {
  typedef double real_t;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
  auto f = square::infinite(Jx, Jy, beta);
  double eps = 1e-12;
  EXPECT_DOUBLE_EQ(-4.0007112633153277, free_energy(f, beta));
  EXPECT_DOUBLE_EQ(-3.9941706779898838, energy(f, beta));
  EXPECT_DOUBLE_EQ(0.024138928587813167, specific_heat(f, beta));
}